

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::
BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleFanTestInstance>::createInstance
          (BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleFanTestInstance> *this,
          Context *context)

{
  BaseRenderingTestInstance *this_00;
  
  this_00 = (BaseRenderingTestInstance *)operator_new(0x290);
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (this_00,context,(this->super_BaseRenderingTestCase).m_sampleCount,0x100);
  this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x300000000;
  *(undefined4 *)&this_00[1].super_TestInstance.m_context = 5;
  *(undefined1 *)((long)&this_00[1].super_TestInstance.m_context + 4) = 1;
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00d2fc50;
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*	createInstance	(Context& context) const
							{
								return new ConcreteTestInstance(context, m_sampleCount);
							}